

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * libtorrent::filename(string *__return_storage_ptr__,string *f)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  allocator<char> local_47;
  allocator local_46;
  allocator local_45;
  int local_44;
  char *pcStack_40;
  int len;
  char *sep;
  char *first;
  allocator<char> local_19;
  string *local_18;
  string *f_local;
  
  local_18 = f;
  f_local = __return_storage_ptr__;
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    sep = (char *)::std::__cxx11::string::c_str();
    pcStack_40 = strrchr(sep,0x2f);
    if (pcStack_40 == (char *)0x0) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
    }
    else {
      lVar4 = (long)pcStack_40 - (long)sep;
      iVar2 = ::std::__cxx11::string::size();
      pcVar5 = sep;
      if (lVar4 == iVar2 + -1) {
        local_44 = 0;
        while (pcVar1 = pcStack_40, sep < pcStack_40) {
          pcStack_40 = pcStack_40 + -1;
          if (*pcStack_40 == '/') {
            uVar3 = (ulong)local_44;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,uVar3,&local_45);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_45);
            return __return_storage_ptr__;
          }
          local_44 = local_44 + 1;
        }
        uVar3 = (ulong)local_44;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,uVar3,&local_46);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_46);
      }
      else {
        pcVar5 = pcStack_40 + 1;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar5,&local_47);
        ::std::allocator<char>::~allocator(&local_47);
      }
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    ::std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string filename(std::string const& f)
	{
		if (f.empty()) return "";
		char const* first = f.c_str();
		char const* sep = std::strrchr(first, '/');
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		char const* altsep = std::strrchr(first, '\\');
		if (sep == nullptr || altsep > sep) sep = altsep;
#endif
		if (sep == nullptr) return f;

		if (sep - first == int(f.size()) - 1)
		{
			// if the last character is a / (or \)
			// ignore it
			int len = 0;
			while (sep > first)
			{
				--sep;
				if (*sep == '/'
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
					|| *sep == '\\'
#endif
					)
					return std::string(sep + 1, std::size_t(len));
				++len;
			}
			return std::string(first, std::size_t(len));

		}
		return std::string(sep + 1);
	}